

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>::optional
          (optional<std::pair<pbrt::LightHandle,_unsigned_int>_> *this,
          optional<std::pair<pbrt::LightHandle,_unsigned_int>_> *v)

{
  bool bVar1;
  pair<pbrt::LightHandle,_unsigned_int> *ppVar2;
  
  bVar1 = v->set;
  this->set = bVar1;
  if (bVar1 == true) {
    ppVar2 = value(v);
    (this->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    (this->optionalValue).__align =
         (anon_struct_8_0_00000001_for___align)
         (ppVar2->first).
         super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
         .bits;
    *(uint *)((long)&this->optionalValue + 8) = ppVar2->second;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    bool has_value() const { return set; }